

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.cpp
# Opt level: O3

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* spvtools::utils::SplitFlagArgs
            (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,string *flag)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined7 local_48;
  undefined1 uStack_41;
  undefined7 local_40;
  undefined1 uStack_39;
  size_type local_38;
  undefined8 uStack_30;
  
  if (flag->_M_string_length < 2) {
    local_68._M_string_length = 0;
    local_68.field_2._M_local_buf[0] = '\0';
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (__return_storage_ptr__,flag,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,
                      CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                               local_68.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    lVar2 = std::__cxx11::string::find((char)flag,0x3d);
    if (lVar2 == -1) {
      std::__cxx11::string::substr((ulong)&local_68,(ulong)flag);
      paVar1 = &(__return_storage_ptr__->first).field_2;
      (__return_storage_ptr__->first)._M_dataplus._M_p = (pointer)paVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p == &local_68.field_2) {
        paVar1->_M_allocated_capacity =
             CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,local_68.field_2._M_local_buf[0])
        ;
        *(undefined8 *)((long)&(__return_storage_ptr__->first).field_2 + 8) = local_68.field_2._8_8_
        ;
      }
      else {
        (__return_storage_ptr__->first)._M_dataplus._M_p = local_68._M_dataplus._M_p;
        (__return_storage_ptr__->first).field_2._M_allocated_capacity =
             CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,local_68.field_2._M_local_buf[0])
        ;
      }
      (__return_storage_ptr__->first)._M_string_length = local_68._M_string_length;
      (__return_storage_ptr__->second)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->second).field_2;
      (__return_storage_ptr__->second).field_2._M_local_buf[0] = '\0';
      *(ulong *)((long)&(__return_storage_ptr__->second).field_2 + 1) = CONCAT17(uStack_41,local_48)
      ;
      *(ulong *)((long)&(__return_storage_ptr__->second).field_2 + 8) = CONCAT71(local_40,uStack_41)
      ;
      (__return_storage_ptr__->second)._M_string_length = 0;
    }
    else {
      std::__cxx11::string::substr((ulong)&local_68,(ulong)flag);
      std::__cxx11::string::substr((ulong)&local_48,(ulong)flag);
      paVar1 = &(__return_storage_ptr__->first).field_2;
      (__return_storage_ptr__->first)._M_dataplus._M_p = (pointer)paVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p == &local_68.field_2) {
        paVar1->_M_allocated_capacity =
             CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,local_68.field_2._M_local_buf[0])
        ;
        *(undefined8 *)((long)&(__return_storage_ptr__->first).field_2 + 8) = local_68.field_2._8_8_
        ;
      }
      else {
        (__return_storage_ptr__->first)._M_dataplus._M_p = local_68._M_dataplus._M_p;
        (__return_storage_ptr__->first).field_2._M_allocated_capacity =
             CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,local_68.field_2._M_local_buf[0])
        ;
      }
      (__return_storage_ptr__->first)._M_string_length = local_68._M_string_length;
      paVar1 = &(__return_storage_ptr__->second).field_2;
      (__return_storage_ptr__->second)._M_dataplus._M_p = (pointer)paVar1;
      if ((size_type *)CONCAT17(uStack_41,local_48) == &local_38) {
        paVar1->_M_allocated_capacity = local_38;
        *(undefined8 *)((long)&(__return_storage_ptr__->second).field_2 + 8) = uStack_30;
      }
      else {
        (__return_storage_ptr__->second)._M_dataplus._M_p = (pointer)CONCAT17(uStack_41,local_48);
        (__return_storage_ptr__->second).field_2._M_allocated_capacity = local_38;
      }
      (__return_storage_ptr__->second)._M_string_length = CONCAT17(uStack_39,local_40);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::string, std::string> SplitFlagArgs(const std::string& flag) {
  if (flag.size() < 2) return make_pair(flag, std::string());

  // Detect the last dash before the pass name. Since we have to
  // handle single dash options (-O and -Os), count up to two dashes.
  size_t dash_ix = 0;
  if (flag[0] == '-' && flag[1] == '-')
    dash_ix = 2;
  else if (flag[0] == '-')
    dash_ix = 1;

  size_t ix = flag.find('=');
  return (ix != std::string::npos)
             ? make_pair(flag.substr(dash_ix, ix - 2), flag.substr(ix + 1))
             : make_pair(flag.substr(dash_ix), std::string());
}